

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.cpp
# Opt level: O2

SharedOptPtr __thiscall
Potassco::ProgramOptions::anon_unknown_15::DefaultContext::getOption
          (DefaultContext *this,int param_1,char *tok)

{
  code *pcVar1;
  char cVar2;
  char *in_RCX;
  undefined4 in_register_00000034;
  long *plVar3;
  allocator local_61;
  string optName;
  string local_40 [32];
  
  plVar3 = (long *)CONCAT44(in_register_00000034,param_1);
  optName._M_dataplus._M_p = (pointer)&optName.field_2;
  optName._M_string_length = 0;
  optName.field_2._M_local_buf[0] = '\0';
  pcVar1 = (code *)plVar3[1];
  if (pcVar1 != (code *)0x0) {
    std::__cxx11::string::string(local_40,in_RCX,&local_61);
    cVar2 = (*pcVar1)(local_40,&optName);
    std::__cxx11::string::~string(local_40);
    if (cVar2 != '\0') {
      (**(code **)(*plVar3 + 0x10))(this,plVar3,optName._M_dataplus._M_p,3);
      goto LAB_00112d82;
    }
  }
  (**(code **)(*plVar3 + 0x10))(this,plVar3,"Positional Option",3);
LAB_00112d82:
  std::__cxx11::string::~string((string *)&optName);
  return (SharedOptPtr)(Option *)this;
}

Assistant:

SharedOptPtr  getOption(int, const char* tok) {
		std::string optName;
		if (!posOpt || !posOpt(tok, optName)) { return getOption("Positional Option", OptionContext::find_name_or_prefix); }
		return getOption(optName.c_str(), OptionContext::find_name_or_prefix);
	}